

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

char * preprocessor_sourcepos(Preprocessor *_ctx,uint *pos)

{
  Context_conflict1 *ctx;
  uint *pos_local;
  Preprocessor *_ctx_local;
  
  if (*(long *)(_ctx + 0x120) == 0) {
    *pos = 0;
    _ctx_local = (Preprocessor *)0x0;
  }
  else {
    *pos = *(uint *)(*(long *)(_ctx + 0x120) + 0x4c);
    _ctx_local = (Preprocessor *)**(undefined8 **)(_ctx + 0x120);
  }
  return (char *)_ctx_local;
}

Assistant:

const char *preprocessor_sourcepos(Preprocessor *_ctx, unsigned int *pos)
{
    Context *ctx = (Context *) _ctx;
    if (ctx->include_stack == NULL)
    {
        *pos = 0;
        return NULL;
    } // if

    *pos = ctx->include_stack->line;
    return ctx->include_stack->filename;
}